

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void StoreSymbol(BlockEncoder *self,size_t symbol,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  BlockSplitCode *pBVar8;
  bool bVar9;
  uint local_1cc;
  uint local_1c8;
  uint local_1c4;
  size_t ix;
  uint8_t block_type;
  uint32_t block_len;
  size_t block_ix;
  uint8_t *storage_local;
  size_t *storage_ix_local;
  size_t symbol_local;
  BlockEncoder *self_local;
  uint64_t v_3;
  uint8_t *p_3;
  uint32_t len_extra;
  uint32_t len_nextra;
  size_t lencode;
  size_t typecode;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  size_t type_code;
  uint local_10;
  uint32_t code;
  
  if (self->block_len_ == 0) {
    sVar5 = self->block_ix_ + 1;
    self->block_ix_ = sVar5;
    uVar2 = self->block_lengths_[sVar5];
    bVar1 = self->block_types_[sVar5];
    self->block_len_ = (ulong)uVar2;
    self->entropy_ix_ = (ulong)bVar1 * self->histogram_length_;
    pBVar8 = &self->block_split_code_;
    if ((ulong)bVar1 == (pBVar8->type_code_calculator).last_type + 1) {
      local_1c4 = 1;
    }
    else {
      if ((ulong)bVar1 == (self->block_split_code_).type_code_calculator.second_last_type) {
        local_1c8 = 0;
      }
      else {
        local_1c8 = bVar1 + 2;
      }
      local_1c4 = local_1c8;
    }
    (self->block_split_code_).type_code_calculator.second_last_type =
         (pBVar8->type_code_calculator).last_type;
    (pBVar8->type_code_calculator).last_type = (ulong)bVar1;
    bVar1 = (self->block_split_code_).type_depths[local_1c4];
    *(ulong *)(storage + (*storage_ix >> 3)) =
         (ulong)(self->block_split_code_).type_bits[local_1c4] << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = (ulong)bVar1 + *storage_ix;
    if (uVar2 < 0xb1) {
      local_1cc = 0;
      if (0x28 < uVar2) {
        local_1cc = 7;
      }
    }
    else {
      local_1cc = 0xe;
      if (0x2f0 < uVar2) {
        local_1cc = 0x14;
      }
    }
    local_10 = local_1cc;
    while( true ) {
      bVar9 = false;
      if (local_10 < 0x19) {
        bVar9 = kBlockLengthPrefixCode[local_10 + 1].offset <= uVar2;
      }
      if (!bVar9) break;
      local_10 = local_10 + 1;
    }
    uVar7 = (ulong)local_10;
    uVar3 = kBlockLengthPrefixCode[uVar7].nbits;
    uVar4 = kBlockLengthPrefixCode[_len_extra].offset;
    bVar1 = (self->block_split_code_).length_depths[uVar7];
    *(ulong *)(storage + (*storage_ix >> 3)) =
         (ulong)(self->block_split_code_).length_bits[uVar7] << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = (ulong)bVar1 + *storage_ix;
    *(ulong *)(storage + (*storage_ix >> 3)) =
         (ulong)(uVar2 - uVar4) << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = (ulong)uVar3 + *storage_ix;
  }
  self->block_len_ = self->block_len_ - 1;
  lVar6 = self->entropy_ix_ + symbol;
  bVar1 = self->depths_[lVar6];
  *(ulong *)(storage + (*storage_ix >> 3)) =
       (ulong)self->bits_[lVar6] << ((byte)*storage_ix & 7) |
       (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
  *storage_ix = (ulong)bVar1 + *storage_ix;
  return;
}

Assistant:

static void StoreSymbol(BlockEncoder* self, size_t symbol, size_t* storage_ix,
    uint8_t* storage) {
  if (self->block_len_ == 0) {
    size_t block_ix = ++self->block_ix_;
    uint32_t block_len = self->block_lengths_[block_ix];
    uint8_t block_type = self->block_types_[block_ix];
    self->block_len_ = block_len;
    self->entropy_ix_ = block_type * self->histogram_length_;
    StoreBlockSwitch(&self->block_split_code_, block_len, block_type, 0,
        storage_ix, storage);
  }
  --self->block_len_;
  {
    size_t ix = self->entropy_ix_ + symbol;
    BrotliWriteBits(self->depths_[ix], self->bits_[ix], storage_ix, storage);
  }
}